

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rstarplanner.cpp
# Opt level: O0

void __thiscall RSTARPlanner::PrintSearchPath(RSTARPlanner *this,FILE *fOut)

{
  size_type sVar1;
  undefined8 in_RSI;
  vector<int,_std::allocator<int>_> *in_RDI;
  int sind;
  int solcost;
  vector<int,_std::allocator<int>_> pathIds;
  int *in_stack_00000280;
  RSTARPlanner *in_stack_00000288;
  long *__n;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int iVar2;
  int local_58;
  vector<int,_std::allocator<int>_> local_28;
  undefined8 local_10;
  
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a9ea2);
  GetSearchPath(in_stack_00000288,in_stack_00000280);
  std::vector<int,_std::allocator<int>_>::operator=
            (in_RDI,(vector<int,_std::allocator<int>_> *)
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  local_58 = 0;
  while( true ) {
    iVar2 = local_58;
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&local_28);
    if ((int)sVar1 <= iVar2) break;
    __n = (long *)(in_RDI->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
    in_stack_ffffffffffffff90 =
         (vector<int,_std::allocator<int>_> *)
         std::vector<int,_std::allocator<int>_>::at(in_stack_ffffffffffffff90,(size_type)__n);
    (**(code **)(*__n + 0x90))
              (__n,*(value_type *)
                    &(in_stack_ffffffffffffff90->super__Vector_base<int,_std::allocator<int>_>).
                     _M_impl.super__Vector_impl_data._M_start,0,local_10);
    local_58 = local_58 + 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector(in_RDI);
  return;
}

Assistant:

void RSTARPlanner::PrintSearchPath(FILE* fOut)
{
    vector<int> pathIds;
    int solcost;

    pathIds = GetSearchPath(solcost);

    SBPL_FPRINTF(fOut, "high-level solution cost = %d, solution length=%d\n", solcost, (unsigned int)pathIds.size());
    for (int sind = 0; sind < (int)pathIds.size(); sind++) {
        environment_->PrintState(pathIds.at(sind), false, fOut);
    }
}